

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall
sznet::net::TcpServer::newConnection(TcpServer *this,sz_sock sockfd,InetAddress *peerAddr)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EventLoop *this_00;
  pointer pcVar2;
  ulong __n;
  element_type *peVar3;
  bool bVar4;
  ulong uVar5;
  TcpConnection *this_01;
  mapped_type *pmVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SourceFile file;
  undefined1 local_10c8 [24];
  uint32_t uStack_10b0;
  char acStack_10ac [3988];
  char *local_118 [4];
  char local_f8 [8];
  char buf [64];
  undefined1 auStack_98 [8];
  InetAddress localAddr;
  undefined1 local_70 [8];
  string connName;
  element_type *local_48;
  TcpConnectionPtr conn;
  uint32_t connId;
  
  this_00 = this->m_loop;
  bVar4 = EventLoop::isInLoopThread(this_00);
  if (!bVar4) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  connName.field_2._8_8_ =
       EventLoopThreadPool::getNextLoop
                 ((this->m_threadPool).
                  super___shared_ptr<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = this->m_nextConnId;
  this->m_nextConnId =
       conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._4_4_ + 1;
  snprintf(local_f8,0x40,"-%s#%d",(this->m_ipPort)._M_dataplus._M_p);
  local_70 = (undefined1  [8])&connName._M_string_length;
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)local_70);
  if (g_logLevel < 3) {
    file._8_8_ = 0xd;
    file.m_data = "TcpServer.cpp";
    Logger::Logger((Logger *)local_10c8,file,0x46);
    uVar5 = (long)local_118 - (long)local_118[0];
    if (0x1a < (uint)uVar5) {
      builtin_strncpy(local_118[0],"TcpServer::newConnection [",0x1a);
      local_118[0] = local_118[0] + 0x1a;
      uVar5 = (long)local_118 - (long)local_118[0];
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(int)uVar5) {
      memcpy(local_118[0],(this->m_name)._M_dataplus._M_p,__n);
      local_118[0] = local_118[0] + __n;
      uVar5 = (long)local_118 - (long)local_118[0];
    }
    if (0x14 < (uint)uVar5) {
      builtin_strncpy(local_118[0],"] - new connection [",0x14);
      local_118[0] = local_118[0] + 0x14;
      uVar5 = (long)local_118 - (long)local_118[0];
    }
    if (connName._M_dataplus._M_p < (pointer)(long)(int)uVar5) {
      memcpy(local_118[0],(void *)local_70,(size_t)connName._M_dataplus._M_p);
      local_118[0] = connName._M_dataplus._M_p + (long)local_118[0];
      uVar5 = (long)local_118 - (long)local_118[0];
    }
    if ((uVar5 & 0xfffffff8) != 0) {
      builtin_strncpy(local_118[0],"] from ",7);
      local_118[0] = local_118[0] + 7;
    }
    InetAddress::toIpPort_abi_cxx11_((string *)auStack_98,peerAddr);
    uVar5 = CONCAT44(localAddr.field_0.m_addr6.sin6_flowinfo,localAddr.field_0._0_4_);
    if (uVar5 < (ulong)(long)((int)local_118 - (int)local_118[0])) {
      memcpy(local_118[0],(void *)auStack_98,uVar5);
      local_118[0] = local_118[0] + uVar5;
    }
    if (auStack_98 != (undefined1  [8])((long)&localAddr.field_0 + 8)) {
      operator_delete((void *)auStack_98);
    }
    Logger::~Logger((Logger *)local_10c8);
  }
  sockets::sz_sock_getlocaladdr((sockaddr_in6 *)local_10c8,sockfd);
  auStack_98 = (undefined1  [8])local_10c8._0_8_;
  this_01 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_01,(EventLoop *)connName.field_2._8_8_,(string *)local_70,
             conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_,sockfd,(InetAddress *)auStack_98,peerAddr);
  std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::TcpConnection,void>
            ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_48,this_01
            );
  pmVar6 = std::
           map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
           ::operator[](&this->m_connections,
                        (key_type *)
                        ((long)&conn.
                                super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 4));
  (pmVar6->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       local_48;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar6->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            (&local_48->m_connectionCallback,&this->m_connectionCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::operator=(&local_48->m_messageCallback,&this->m_messageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            (&local_48->m_writeCompleteCallback,&this->m_writeCompleteCallback);
  peVar3 = local_48;
  local_10c8._8_4_ = 0;
  local_10c8._12_4_ = 0;
  local_10c8._0_8_ = operator_new(0x18);
  *(code **)local_10c8._0_8_ = removeConnection;
  *(undefined8 *)(local_10c8._0_8_ + 8) = 0;
  uStack_10b0 = 0x121968;
  acStack_10ac[0] = '\0';
  acStack_10ac[1] = '\0';
  acStack_10ac[2] = '\0';
  acStack_10ac[3] = '\0';
  *(TcpServer **)(local_10c8._0_8_ + 0x10) = this;
  local_10c8._16_4_ = 0x12198a;
  local_10c8._20_4_ = 0;
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            (&peVar3->m_closeCallback,
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_10c8);
  if ((code *)CONCAT44(local_10c8._20_4_,local_10c8._16_4_) != (code *)0x0) {
    (*(code *)CONCAT44(local_10c8._20_4_,local_10c8._16_4_))(local_10c8,local_10c8,3);
  }
  peVar3 = conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
                super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &((conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
                super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf._56_8_ = operator_new(0x20);
  *(code **)buf._56_8_ = TcpConnection::connectEstablished;
  *(undefined8 *)(buf._56_8_ + 8) = 0;
  *(element_type **)(buf._56_8_ + 0x10) = local_48;
  *(element_type **)(buf._56_8_ + 0x18) = peVar3;
  EventLoop::runInLoop((EventLoop *)connName.field_2._8_8_,(Functor *)(buf + 0x38));
  std::
  _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
  ::_M_manager((_Any_data *)(buf + 0x38),(_Any_data *)(buf + 0x38),__destroy_functor);
  if (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  if (local_70 != (undefined1  [8])&connName._M_string_length) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

void TcpServer::newConnection(sockets::sz_sock sockfd, const InetAddress& peerAddr)
{
	m_loop->assertInLoopThread();
	EventLoop* ioLoop = m_threadPool->getNextLoop();
	char buf[64];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), "-%s#%d", m_ipPort.c_str(), connId);
	string connName = m_name + buf;

	LOG_INFO << "TcpServer::newConnection [" << m_name
		<< "] - new connection [" << connName
		<< "] from " << peerAddr.toIpPort();
	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// ��������
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(ioLoop, connName, connId, sockfd, localAddr, peerAddr));
	m_connections[connId] = conn;
	conn->setConnectionCallback(m_connectionCallback);
	conn->setMessageCallback(m_messageCallback);
	conn->setWriteCompleteCallback(m_writeCompleteCallback);
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&TcpServer::removeConnection, this, std::placeholders::_1));
	ioLoop->runInLoop(std::bind(&TcpConnection::connectEstablished, conn));
}